

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

xmlRegexpPtr xmlAutomataCompile(xmlAutomataPtr am)

{
  xmlRegexpPtr pxVar1;
  
  if ((am != (xmlAutomataPtr)0x0) && (am->error == 0)) {
    xmlFAEliminateEpsilonTransitions(am);
    pxVar1 = xmlRegEpxFromParse(am);
    return pxVar1;
  }
  return (xmlRegexpPtr)0x0;
}

Assistant:

xmlRegexpPtr
xmlAutomataCompile(xmlAutomataPtr am) {
    xmlRegexpPtr ret;

    if ((am == NULL) || (am->error != 0)) return(NULL);
    xmlFAEliminateEpsilonTransitions(am);
    /* xmlFAComputesDeterminism(am); */
    ret = xmlRegEpxFromParse(am);

    return(ret);
}